

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O2

Value * __thiscall
wabt::Decompiler::Get<(wabt::ExprType)20>
          (Value *__return_storage_ptr__,Decompiler *this,VarExpr<(wabt::ExprType)20> *ve)

{
  string *psVar1;
  string_view name;
  allocator<char> local_69;
  string_view local_68;
  string local_58 [32];
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  psVar1 = Var::name_abi_cxx11_(&ve->var);
  name._M_str = (psVar1->_M_dataplus)._M_p;
  name._M_len = psVar1->_M_string_length;
  local_68 = VarName(this,name);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_58,&local_68,&local_69);
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_range_initialize<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_38,local_58
             ,&local_38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&__return_storage_ptr__->v,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_38);
  __return_storage_ptr__->precedence = Atomic;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_38);
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

Value Get(const VarExpr<T>& ve) {
    return Value{{std::string(VarName(ve.var.name()))}, Precedence::Atomic};
  }